

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample.c
# Opt level: O0

int speex_resampler_process_int
              (SpeexResamplerState *st,uint channel_index,short *in,uint *in_len,short *out,
              uint *out_len)

{
  int iVar1;
  int iVar2;
  undefined2 uVar3;
  uint uVar4;
  long lVar5;
  uint *in_RCX;
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  long in_R8;
  uint *in_R9;
  double dVar6;
  uint omagic;
  uint ochunk;
  uint ichunk;
  spx_word16_t *y;
  spx_word16_t ystack [1024];
  uint ylen;
  uint xlen;
  spx_word16_t *x;
  uint olen;
  uint ilen;
  int ostride_save;
  int istride_save;
  int j;
  uint local_1078;
  uint in_stack_ffffffffffffef90;
  int iVar7;
  uint uVar8;
  SpeexResamplerState *st_00;
  float local_1058;
  uint in_stack_ffffffffffffefac;
  SpeexResamplerState *in_stack_ffffffffffffefb0;
  uint local_44;
  uint local_40;
  uint local_34;
  long local_28;
  long local_18;
  
  iVar1 = *(int *)(in_RDI + 0x78);
  iVar2 = *(int *)(in_RDI + 0x7c);
  local_40 = *in_RCX;
  local_44 = *in_R9;
  lVar5 = *(long *)(in_RDI + 0x58) + (ulong)(in_ESI * *(int *)(in_RDI + 0x1c)) * 4;
  uVar4 = *(int *)(in_RDI + 0x1c) - (*(int *)(in_RDI + 0x18) + -1);
  *(undefined4 *)(in_RDI + 0x7c) = 1;
  local_28 = in_R8;
  local_18 = in_RDX;
  while( true ) {
    uVar8 = in_stack_ffffffffffffef90 & 0xffffff;
    if (local_40 != 0) {
      uVar8 = CONCAT13(local_44 != 0,(int3)in_stack_ffffffffffffef90);
    }
    in_stack_ffffffffffffef90 = uVar8;
    if ((char)(in_stack_ffffffffffffef90 >> 0x18) == '\0') break;
    st_00 = (SpeexResamplerState *)&local_1058;
    uVar8 = local_40;
    if (uVar4 < local_40) {
      uVar8 = uVar4;
    }
    if (local_44 < 0x401) {
      local_1078 = local_44;
    }
    else {
      local_1078 = 0x400;
    }
    iVar7 = 0;
    if (*(int *)(*(long *)(in_RDI + 0x50) + (ulong)in_ESI * 4) != 0) {
      iVar7 = speex_resampler_magic
                        (st_00,uVar8,(spx_word16_t **)(ulong)in_stack_ffffffffffffef90,uVar8);
      local_1078 = local_1078 - iVar7;
      local_44 = local_44 - iVar7;
    }
    if (*(int *)(*(long *)(in_RDI + 0x50) + (ulong)in_ESI * 4) == 0) {
      if (local_18 == 0) {
        for (local_34 = 0; local_34 < uVar8; local_34 = local_34 + 1) {
          *(undefined4 *)(lVar5 + (ulong)((local_34 + *(int *)(in_RDI + 0x18)) - 1) * 4) = 0;
        }
      }
      else {
        for (local_34 = 0; local_34 < uVar8; local_34 = local_34 + 1) {
          *(float *)(lVar5 + (ulong)((local_34 + *(int *)(in_RDI + 0x18)) - 1) * 4) =
               (float)(int)*(short *)(local_18 + (long)(int)(local_34 * iVar1) * 2);
        }
      }
      speex_resampler_process_native
                (in_stack_ffffffffffffefb0,in_stack_ffffffffffffefac,&st_00->in_rate,
                 (spx_word16_t *)CONCAT44(uVar8,local_1078),
                 (uint *)CONCAT44(iVar7,in_stack_ffffffffffffef90));
    }
    else {
      uVar8 = 0;
      local_1078 = 0;
    }
    for (local_34 = 0; local_34 < local_1078 + iVar7; local_34 = local_34 + 1) {
      if (-32767.5 < (&local_1058)[(int)local_34] || (&local_1058)[(int)local_34] == -32767.5) {
        if ((&local_1058)[(int)local_34] <= 32766.5) {
          dVar6 = floor((double)(&local_1058)[(int)local_34] + 0.5);
          uVar3 = (undefined2)(int)dVar6;
        }
        else {
          uVar3 = 0x7fff;
        }
      }
      else {
        uVar3 = 0x8000;
      }
      *(undefined2 *)(local_28 + (long)(int)(local_34 * iVar2) * 2) = uVar3;
    }
    local_40 = local_40 - uVar8;
    local_44 = local_44 - local_1078;
    local_28 = local_28 + (ulong)((local_1078 + iVar7) * iVar2) * 2;
    if (local_18 != 0) {
      local_18 = local_18 + (ulong)(uVar8 * iVar1) * 2;
    }
  }
  *(int *)(in_RDI + 0x7c) = iVar2;
  *in_RCX = *in_RCX - local_40;
  *in_R9 = *in_R9 - local_44;
  return (uint)(*(code **)(in_RDI + 0x70) == resampler_basic_zero);
}

Assistant:

EXPORT int speex_resampler_process_int(SpeexResamplerState *st, spx_uint32_t channel_index, const spx_int16_t *in, spx_uint32_t *in_len, spx_int16_t *out, spx_uint32_t *out_len)
#else
EXPORT int speex_resampler_process_float(SpeexResamplerState *st, spx_uint32_t channel_index, const float *in, spx_uint32_t *in_len, float *out, spx_uint32_t *out_len)
#endif
{
   int j;
   spx_uint32_t ilen = *in_len;
   spx_uint32_t olen = *out_len;
   spx_word16_t *x = st->mem + channel_index * st->mem_alloc_size;
   const int filt_offs = st->filt_len - 1;
   const spx_uint32_t xlen = st->mem_alloc_size - filt_offs;
   const int istride = st->in_stride;

   if (st->magic_samples[channel_index])
      olen -= speex_resampler_magic(st, channel_index, &out, olen);
   if (! st->magic_samples[channel_index]) {
      while (ilen && olen) {
        spx_uint32_t ichunk = (ilen > xlen) ? xlen : ilen;
        spx_uint32_t ochunk = olen;

        if (in) {
           for(j=0;j<ichunk;++j)
              x[j+filt_offs]=in[j*istride];
        } else {
          for(j=0;j<ichunk;++j)
            x[j+filt_offs]=0;
        }
        speex_resampler_process_native(st, channel_index, &ichunk, out, &ochunk);
        ilen -= ichunk;
        olen -= ochunk;
        out += ochunk * st->out_stride;
        if (in)
           in += ichunk * istride;
      }
   }
   *in_len -= ilen;
   *out_len -= olen;
   return st->resampler_ptr == resampler_basic_zero ? RESAMPLER_ERR_ALLOC_FAILED : RESAMPLER_ERR_SUCCESS;
}